

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O1

void __thiscall NukedOPL3::WriteReg(NukedOPL3 *this,int reg,int v)

{
  opl_slot **ppoVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  short sVar5;
  uint uVar6;
  byte data;
  short sVar7;
  opl_channel *poVar8;
  
  uVar6 = (uint)reg >> 4 & 0xf;
  if (uVar6 < 0x10) {
    uVar3 = (uint)reg >> 8;
    data = (byte)v;
    switch(uVar6) {
    case 0:
      uVar6 = reg & 0xf;
      if ((uVar3 & 1) == 0) {
        if (uVar6 == 8) {
          (this->opl3).nts = data >> 6 & 1;
        }
      }
      else if (uVar6 == 5) {
        (this->opl3).newm = data & 1;
      }
      else if (uVar6 == 4) {
        chan_set4op(&this->opl3,data);
        return;
      }
      break;
    case 2:
    case 3:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar6 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar3 & 1) == 0) {
          uVar6 = (int)""[reg & 0x1fU];
        }
        slot_write20((this->opl3).slot + uVar6,data);
        return;
      }
      break;
    case 4:
    case 5:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar6 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar3 & 1) == 0) {
          uVar6 = (int)""[reg & 0x1fU];
        }
        (this->opl3).slot[uVar6].reg_ksl = (byte)((uint)v >> 6) & 3;
        (this->opl3).slot[uVar6].reg_tl = data & 0x3f;
        poVar8 = (this->opl3).slot[uVar6].channel;
        sVar5 = (ushort)poVar8->block * 0x20 + (ushort)""[poVar8->f_num >> 6] * 4 + -0x100;
        sVar7 = 0;
        if (0 < sVar5) {
          sVar7 = sVar5;
        }
        (this->opl3).slot[uVar6].eg_ksl = (Bit8u)sVar7;
      }
      break;
    case 6:
    case 7:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar6 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar3 & 1) == 0) {
          uVar6 = (int)""[reg & 0x1fU];
        }
        ppoVar1 = (this->opl3).channel[0].slots + (ulong)uVar6 * 9 + -1;
        *(byte *)((long)ppoVar1 + 0x676) = (byte)((uint)v >> 4) & 0xf;
        *(byte *)((long)ppoVar1 + 0x677) = data & 0xf;
LAB_003235ca:
        envelope_update_rate((opl_slot *)(ppoVar1 + 199));
        return;
      }
      break;
    case 8:
    case 9:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar6 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar3 & 1) == 0) {
          uVar6 = (int)""[reg & 0x1fU];
        }
        ppoVar1 = (this->opl3).channel[0].slots + (ulong)uVar6 * 9 + -1;
        bVar2 = (byte)((uint)v >> 4) & 0xf;
        bVar4 = 0x1f;
        if (bVar2 != 0xf) {
          bVar4 = bVar2;
        }
        *(byte *)(ppoVar1 + 0xcf) = bVar4;
        *(byte *)((long)ppoVar1 + 0x679) = data & 0xf;
        goto LAB_003235ca;
      }
      break;
    case 10:
      if ((reg & 0xfU) < 9) {
        chan_writea0((this->opl3).channel + ((uVar3 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xb:
      if ((char)reg == -0x43 && (reg & 0x100U) == 0) {
        (this->opl3).dam = (byte)((uint)v >> 7) & 1;
        (this->opl3).dvb = data >> 6 & 1;
        chan_updaterhythm(&this->opl3,data);
        return;
      }
      if ((reg & 0xfU) < 9) {
        poVar8 = (this->opl3).channel + ((uVar3 & 1) * 9 + (reg & 0xfU));
        chan_writeb0(poVar8,data);
        if ((v & 0x20U) == 0) {
          chan_disable(poVar8);
          return;
        }
        chan_enable(poVar8);
        return;
      }
      break;
    case 0xc:
      if ((reg & 0xfU) < 9) {
        chan_writec0((this->opl3).channel + ((uVar3 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xe:
    case 0xf:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar6 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar3 & 1) == 0) {
          uVar6 = (int)""[reg & 0x1fU];
        }
        (this->opl3).slot[uVar6].reg_wf = data & 7;
        if (((this->opl3).slot[uVar6].chip)->newm == '\0') {
          (this->opl3).slot[uVar6].reg_wf = data & 3;
        }
      }
    }
  }
  return;
}

Assistant:

void NukedOPL3::WriteReg(int reg, int v) {
	v &= 0xff;
	reg &= 0x1ff;
	Bit8u high = (reg >> 8) & 0x01;
	Bit8u regm = reg & 0xff;
	switch (regm & 0xf0) {
	case 0x00:
		if (high) {
			switch (regm & 0x0f) {
			case 0x04:
				chan_set4op(&opl3, v);
				break;
			case 0x05:
				opl3.newm = v & 0x01;
				break;
			}
		}
		else {
			switch (regm & 0x0f) {
			case 0x08:
				opl3.nts = (v >> 6) & 0x01;
				break;
			}
		}
		break;
	case 0x20:
	case 0x30:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write20(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x40:
	case 0x50:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write40(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x60:
	case 0x70:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write60(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x80:
	case 0x90:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write80(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);;
		}
		break;
	case 0xe0:
	case 0xf0:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_writee0(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0xa0:
		if ((regm & 0x0f) < 9) {
			chan_writea0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	case 0xb0:
		if (regm == 0xbd && !high) {
			opl3.dam = v >> 7;
			opl3.dvb = (v >> 6) & 0x01;
			chan_updaterhythm(&opl3, v);
		}
		else if ((regm & 0x0f) < 9) {
			chan_writeb0(&opl3.channel[9 * high + (regm & 0x0f)], v);
			if (v & 0x20) {
				chan_enable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
			else {
				chan_disable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
		}
		break;
	case 0xc0:
		if ((regm & 0x0f) < 9) {
			chan_writec0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	}
}